

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

String __thiscall xmrig::Buffer::toHex(Buffer *this)

{
  void *pvVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  String *in_RSI;
  String *in_RDI;
  String SVar3;
  char *buf;
  size_t in_stack_ffffffffffffffc8;
  String *pSVar4;
  
  pSVar4 = in_RDI;
  if (in_RSI->m_size == 0) {
    memset(in_RDI,0,0x10);
    String::String(in_RDI);
    sVar2 = extraout_RDX;
  }
  else {
    pvVar1 = operator_new__(in_RSI->m_size * 2 + 1);
    *(undefined1 *)((long)pvVar1 + in_RSI->m_size * 2) = 0;
    toHex((char *)in_RDI,in_stack_ffffffffffffffc8,(char *)0x1d621c);
    String::String(in_RSI,(char *)pSVar4);
    sVar2 = extraout_RDX_00;
  }
  SVar3.m_size = sVar2;
  SVar3.m_data = (char *)pSVar4;
  return SVar3;
}

Assistant:

xmrig::String xmrig::Buffer::toHex() const
{
    if (m_size == 0) {
        return String();
    }

    char *buf       = new char[m_size * 2 + 1];
    buf[m_size * 2] = '\0';

    toHex(m_data, m_size, buf);

    return String(buf);
}